

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::value_is_likely_non_uniform(Impl *impl,Value *value)

{
  bool bVar1;
  uint uVar2;
  UnaryOperator *this;
  CastInst *this_00;
  ExtractValueInst *this_01;
  BinaryOperator *this_02;
  Value *pVVar3;
  CallInst *this_03;
  bool local_4d;
  uint local_4c;
  uint32_t i;
  CallInst *call;
  BinaryOperator *binary;
  ExtractValueInst *extract_value;
  CastInst *cast_op;
  UnaryOperator *unary;
  Value *value_local;
  Impl *impl_local;
  
  unary = (UnaryOperator *)value;
  while( true ) {
    while( true ) {
      while( true ) {
        bVar1 = LLVMBC::isa<LLVMBC::Constant>((Value *)unary);
        if (bVar1) {
          return false;
        }
        this = LLVMBC::dyn_cast<LLVMBC::UnaryOperator>((Value *)unary);
        if (this == (UnaryOperator *)0x0) break;
        unary = (UnaryOperator *)LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
      }
      this_00 = LLVMBC::dyn_cast<LLVMBC::CastInst>((Value *)unary);
      if (this_00 == (CastInst *)0x0) break;
      unary = (UnaryOperator *)LLVMBC::Instruction::getOperand(&this_00->super_Instruction,0);
    }
    this_01 = LLVMBC::dyn_cast<LLVMBC::ExtractValueInst>((Value *)unary);
    if (this_01 == (ExtractValueInst *)0x0) break;
    unary = (UnaryOperator *)LLVMBC::Instruction::getOperand(&this_01->super_Instruction,0);
  }
  this_02 = LLVMBC::dyn_cast<LLVMBC::BinaryOperator>((Value *)unary);
  if (this_02 == (BinaryOperator *)0x0) {
    bVar1 = value_is_dx_op_instrinsic((Value *)unary,BufferLoad);
    if ((((!bVar1) && (bVar1 = value_is_dx_op_instrinsic((Value *)unary,RawBufferLoad), !bVar1)) &&
        (bVar1 = value_is_dx_op_instrinsic((Value *)unary,CBufferLoad), !bVar1)) &&
       (bVar1 = value_is_dx_op_instrinsic((Value *)unary,CBufferLoadLegacy), !bVar1)) {
      bVar1 = value_is_dx_op_instrinsic((Value *)unary,LoadInput);
      if ((!bVar1) && (bVar1 = value_is_dx_op_instrinsic((Value *)unary,InstanceID), !bVar1)) {
        return false;
      }
      return true;
    }
    this_03 = LLVMBC::cast<LLVMBC::CallInst>((Value *)unary);
    local_4c = 2;
    while( true ) {
      uVar2 = LLVMBC::Instruction::getNumOperands(&this_03->super_Instruction);
      if (uVar2 <= local_4c) {
        return false;
      }
      pVVar3 = LLVMBC::Instruction::getOperand(&this_03->super_Instruction,local_4c);
      bVar1 = value_is_likely_non_uniform(impl,pVVar3);
      if (bVar1) break;
      local_4c = local_4c + 1;
    }
    return true;
  }
  pVVar3 = LLVMBC::Instruction::getOperand(&this_02->super_Instruction,0);
  bVar1 = value_is_likely_non_uniform(impl,pVVar3);
  local_4d = true;
  if (!bVar1) {
    pVVar3 = LLVMBC::Instruction::getOperand(&this_02->super_Instruction,1);
    local_4d = value_is_likely_non_uniform(impl,pVVar3);
  }
  return local_4d;
}

Assistant:

bool value_is_likely_non_uniform(Converter::Impl &impl, const llvm::Value *value)
{
	for (;;)
	{
		// If the index is loaded from PS varying, it's almost guaranteed to be nonuniform in some way.
		// Similar with using InstanceID as bindless index.
		if (llvm::isa<llvm::Constant>(value))
			return false;
		else if (const auto *unary = llvm::dyn_cast<llvm::UnaryOperator>(value))
			value = unary->getOperand(0);
		else if (const auto *cast_op = llvm::dyn_cast<llvm::CastInst>(value))
			value = cast_op->getOperand(0);
		else if (const auto *extract_value = llvm::dyn_cast<llvm::ExtractValueInst>(value))
			value = extract_value->getOperand(0);
		else
			break;
	}

	if (const auto *binary = llvm::dyn_cast<llvm::BinaryOperator>(value))
	{
		return value_is_likely_non_uniform(impl, binary->getOperand(0)) ||
		       value_is_likely_non_uniform(impl, binary->getOperand(1));
	}
	else if (value_is_dx_op_instrinsic(value, DXIL::Op::BufferLoad) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::RawBufferLoad) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::CBufferLoad) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::CBufferLoadLegacy))
	{
		auto *call = llvm::cast<llvm::CallInst>(value);
		for (uint32_t i = 2; i < call->getNumOperands(); i++)
			if (value_is_likely_non_uniform(impl, call->getOperand(i)))
				return true;
		return false;
	}
	else if (value_is_dx_op_instrinsic(value, DXIL::Op::LoadInput) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::InstanceID))
	{
		return true;
	}
	else
		return false;
}